

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextSpan.cpp
# Opt level: O2

ostream * psy::operator<<(ostream *os,TextSpan *span)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  poVar1 = std::operator<<(poVar1,"..");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const TextSpan& span)
{
    os << span.start() << ".." << span.end();
    return os;
}